

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O3

from_chars_result __thiscall semver::detail::lexer::scan_token(lexer *this,token_stream *stream)

{
  pointer *pptVar1;
  byte bVar2;
  size_t sVar3;
  iterator __position;
  undefined8 uVar4;
  ulong uVar5;
  from_chars_result fVar6;
  token local_18;
  
  local_18.lexeme = (this->text_)._M_str;
  sVar3 = this->current_pos_;
  bVar2 = local_18.lexeme[sVar3];
  uVar5 = sVar3 + 1;
  this->current_pos_ = uVar5;
  if (bVar2 < 0x3c) {
    if (bVar2 < 0x2d) {
      if (bVar2 == 0x20) {
        local_18.lexeme = local_18.lexeme + sVar3;
        local_18.type = space;
        local_18.value.
        super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
        super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
        .
        super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
        .super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
        .super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
        .
        super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
             = (_Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
               (_Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                )0x0;
        __position._M_current =
             (stream->tokens).
             super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (stream->tokens).
            super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<semver::detail::token,std::allocator<semver::detail::token>>::
          _M_realloc_insert<semver::detail::token_const&>
                    ((vector<semver::detail::token,std::allocator<semver::detail::token>> *)
                     &stream->tokens,__position,&local_18);
        }
        else {
LAB_00103068:
          (__position._M_current)->type = local_18.type;
          (__position._M_current)->value =
               (value_t)local_18.value.
                        super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                        .
                        super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                        .
                        super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                        .
                        super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                        .
                        super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                        .
                        super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
          ;
          *(undefined5 *)&(__position._M_current)->field_0x3 = local_18._3_5_;
          (__position._M_current)->lexeme = local_18.lexeme;
          pptVar1 = &(stream->tokens).
                     super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pptVar1 = *pptVar1 + 1;
        }
      }
      else if (bVar2 == 0x2b) {
        local_18.lexeme = local_18.lexeme + sVar3;
        local_18.type = plus;
        local_18.value.
        super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
        super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
        .
        super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
        .super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
        .super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
        .
        super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
             = (_Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
               (_Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                )0x0;
        __position._M_current =
             (stream->tokens).
             super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current !=
            (stream->tokens).
            super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00103068;
        std::vector<semver::detail::token,std::allocator<semver::detail::token>>::
        _M_realloc_insert<semver::detail::token_const&>
                  ((vector<semver::detail::token,std::allocator<semver::detail::token>> *)
                   &stream->tokens,__position,&local_18);
      }
      else {
LAB_00102fec:
        if ((byte)(bVar2 - 0x30) < 10) {
          local_18.value.
          super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
          super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
          .
          super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
          .
          super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
          .
          super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
          .
          super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
               = (_Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                 )((byte)(bVar2 - 0x30) | 0x100);
          local_18.lexeme = local_18.lexeme + sVar3;
          local_18.type = digit;
          __position._M_current =
               (stream->tokens).
               super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current !=
              (stream->tokens).
              super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00103068;
          std::vector<semver::detail::token,std::allocator<semver::detail::token>>::
          _M_realloc_insert<semver::detail::token_const&>
                    ((vector<semver::detail::token,std::allocator<semver::detail::token>> *)
                     &stream->tokens,__position,&local_18);
        }
        else {
          if (0x19 < (byte)((bVar2 & 0xdf) + 0xbf)) goto LAB_00103087;
          local_18.value.
          super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
          super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
          .
          super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
          .
          super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
          .
          super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
          .
          super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
               = (_Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                 )(bVar2 | 0x200);
          local_18.lexeme = local_18.lexeme + sVar3;
          local_18.type = letter;
          __position._M_current =
               (stream->tokens).
               super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current !=
              (stream->tokens).
              super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00103068;
          std::vector<semver::detail::token,std::allocator<semver::detail::token>>::
          _M_realloc_insert<semver::detail::token_const&>
                    ((vector<semver::detail::token,std::allocator<semver::detail::token>> *)
                     &stream->tokens,__position,&local_18);
        }
      }
    }
    else if (bVar2 == 0x2d) {
      local_18.lexeme = local_18.lexeme + sVar3;
      local_18.type = hyphen;
      local_18.value.
      super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
           = (_Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
             (_Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
              )0x0;
      __position._M_current =
           (stream->tokens).
           super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (stream->tokens).
          super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) goto LAB_00103068;
      std::vector<semver::detail::token,std::allocator<semver::detail::token>>::
      _M_realloc_insert<semver::detail::token_const&>
                ((vector<semver::detail::token,std::allocator<semver::detail::token>> *)
                 &stream->tokens,__position,&local_18);
    }
    else {
      if (bVar2 != 0x2e) goto LAB_00102fec;
      local_18.lexeme = local_18.lexeme + sVar3;
      local_18.type = dot;
      local_18.value.
      super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
           = (_Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
             (_Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
              )0x0;
      __position._M_current =
           (stream->tokens).
           super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (stream->tokens).
          super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) goto LAB_00103068;
      std::vector<semver::detail::token,std::allocator<semver::detail::token>>::
      _M_realloc_insert<semver::detail::token_const&>
                ((vector<semver::detail::token,std::allocator<semver::detail::token>> *)
                 &stream->tokens,__position,&local_18);
    }
  }
  else if (bVar2 < 0x3e) {
    if (bVar2 == 0x3c) {
      local_18.value.
      super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
           = (_Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
             (_Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
              )0x300;
      if ((uVar5 < (this->text_)._M_len) && (local_18.lexeme[uVar5] == '=')) {
        uVar5 = sVar3 + 2;
        this->current_pos_ = uVar5;
        local_18.value.
        super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
        super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
        .
        super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
        .super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
        .super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
        .
        super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
             = (_Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
               (_Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                )0x301;
      }
      local_18.lexeme = local_18.lexeme + (uVar5 - 1);
      local_18.type = range_operator;
      __position._M_current =
           (stream->tokens).
           super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (stream->tokens).
          super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) goto LAB_00103068;
      std::vector<semver::detail::token,std::allocator<semver::detail::token>>::
      _M_realloc_insert<semver::detail::token_const&>
                ((vector<semver::detail::token,std::allocator<semver::detail::token>> *)
                 &stream->tokens,__position,&local_18);
    }
    else {
      if (bVar2 != 0x3d) goto LAB_00102fec;
      local_18.lexeme = local_18.lexeme + sVar3;
      local_18.type = range_operator;
      local_18.value.
      super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
           = (_Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
             (_Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
              )0x304;
      __position._M_current =
           (stream->tokens).
           super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (stream->tokens).
          super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) goto LAB_00103068;
      std::vector<semver::detail::token,std::allocator<semver::detail::token>>::
      _M_realloc_insert<semver::detail::token_const&>
                ((vector<semver::detail::token,std::allocator<semver::detail::token>> *)
                 &stream->tokens,__position,&local_18);
    }
  }
  else if (bVar2 == 0x3e) {
    local_18.value.
    super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
         = (_Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
           (_Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
           0x302;
    if ((uVar5 < (this->text_)._M_len) && (local_18.lexeme[uVar5] == '=')) {
      uVar5 = sVar3 + 2;
      this->current_pos_ = uVar5;
      local_18.value.
      super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
           = (_Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
             (_Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
              )0x303;
    }
    local_18.lexeme = local_18.lexeme + (uVar5 - 1);
    local_18.type = range_operator;
    __position._M_current =
         (stream->tokens).
         super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current !=
        (stream->tokens).
        super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_00103068;
    std::vector<semver::detail::token,std::allocator<semver::detail::token>>::
    _M_realloc_insert<semver::detail::token_const&>
              ((vector<semver::detail::token,std::allocator<semver::detail::token>> *)
               &stream->tokens,__position,&local_18);
  }
  else {
    if (bVar2 != 0x7c) goto LAB_00102fec;
    if (((this->text_)._M_len <= uVar5) || (local_18.lexeme[uVar5] != '|')) {
LAB_00103087:
      local_18.lexeme = local_18.lexeme + uVar5;
      uVar4 = 0x16;
      goto LAB_0010307e;
    }
    this->current_pos_ = sVar3 + 2;
    local_18.lexeme = local_18.lexeme + sVar3 + 1;
    local_18.type = logical_or;
    local_18.value.
    super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
         = (_Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
           (_Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
           0x0;
    __position._M_current =
         (stream->tokens).
         super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current !=
        (stream->tokens).
        super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_00103068;
    std::vector<semver::detail::token,std::allocator<semver::detail::token>>::
    _M_realloc_insert<semver::detail::token_const&>
              ((vector<semver::detail::token,std::allocator<semver::detail::token>> *)
               &stream->tokens,__position,&local_18);
  }
  local_18.lexeme = (this->text_)._M_str + this->current_pos_;
  uVar4 = 0;
LAB_0010307e:
  fVar6.super_from_chars_result.ptr = local_18.lexeme + -1;
  fVar6.super_from_chars_result._8_8_ = uVar4;
  return (from_chars_result)fVar6.super_from_chars_result;
}

Assistant:

scan_token(token_stream& stream) noexcept {
    const char c = advance();

    switch (c) {
    case ' ':
      add_token(stream, token_type::space);
      break;
    case '.':
      add_token(stream, token_type::dot);
      break;
    case '-':
      add_token(stream, token_type::hyphen);
      break;
    case '+':
      add_token(stream, token_type::plus);
      break;
    case '|':
      if (advanceIfMatch('|')) {
        add_token(stream, token_type::logical_or);
        break;
      }
      return failure(get_prev_symbol());
    case '<':
      add_token(stream, token_type::range_operator, advanceIfMatch('=') ? range_operator::less_or_equal : range_operator::less);
      break;
    case '>':
      add_token(stream, token_type::range_operator, advanceIfMatch('=') ? range_operator::greater_or_equal : range_operator::greater);
      break;
    case '=':
      add_token(stream, token_type::range_operator, range_operator::equal);
      break;
    default:
      if (is_digit(c)) {
        add_token(stream, token_type::digit, to_digit(c));
        break;
      }
      else if (is_letter(c)) {
        add_token(stream, token_type::letter, c);
        break;
      }
      return failure(get_prev_symbol());
    }

    return success(get_prev_symbol());
  }